

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::String_const&>(String *__return_storage_ptr__,kj *this,String *params)

{
  void *__src;
  ulong uVar1;
  String *result;
  char *__dest;
  size_t size;
  
  __src = *(void **)this;
  uVar1 = *(ulong *)(this + 8);
  size = 0;
  if (uVar1 != 0) {
    size = uVar1 - 1;
  }
  heapString(__return_storage_ptr__,size);
  if (1 < uVar1) {
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    memcpy(__dest,__src,size);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}